

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Persistence_vectors.h
# Opt level: O1

void __thiscall
Gudhi::Persistence_representations::Vector_distances_in_diagram<Gudhi::Euclidean_distance>::
load_from_file(Vector_distances_in_diagram<Gudhi::Euclidean_distance> *this,char *filename)

{
  iterator __position;
  istream *piVar1;
  ostream *poVar2;
  undefined8 *puVar3;
  double number;
  ifstream in;
  double local_230;
  double local_228 [4];
  int aiStack_208 [122];
  
  std::ifstream::ifstream(local_228);
  std::ifstream::open((char *)local_228,(_Ios_Openmode)filename);
  if (*(int *)((long)aiStack_208 + *(long *)((long)local_228[0] + -0x18)) == 0) {
    while( true ) {
      piVar1 = std::istream::_M_extract<double>(local_228);
      if (((byte)piVar1[*(long *)(*(long *)piVar1 + -0x18) + 0x20] & 5) != 0) break;
      __position._M_current =
           (this->sorted_vector_of_distances).super__Vector_base<double,_std::allocator<double>_>.
           _M_impl.super__Vector_impl_data._M_finish;
      if (__position._M_current ==
          (this->sorted_vector_of_distances).super__Vector_base<double,_std::allocator<double>_>.
          _M_impl.super__Vector_impl_data._M_end_of_storage) {
        std::vector<double,std::allocator<double>>::_M_realloc_insert<double_const&>
                  ((vector<double,std::allocator<double>> *)&this->sorted_vector_of_distances,
                   __position,&local_230);
      }
      else {
        *__position._M_current = local_230;
        (this->sorted_vector_of_distances).super__Vector_base<double,_std::allocator<double>_>.
        _M_impl.super__Vector_impl_data._M_finish = __position._M_current + 1;
      }
    }
    std::ifstream::close();
    std::ifstream::~ifstream(local_228);
    return;
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"The file : ",0xb);
  poVar2 = std::operator<<((ostream *)&std::cerr,filename);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar2," do not exist. The program will now terminate \n",0x2f);
  puVar3 = (undefined8 *)__cxa_allocate_exception(8);
  *puVar3 = "The persistence landscape file do not exist. The program will now terminate \n";
  __cxa_throw(puVar3,&char_const*::typeinfo,0);
}

Assistant:

void Vector_distances_in_diagram<F>::load_from_file(const char* filename) {
  std::ifstream in;
  in.open(filename);
  // check if the file exist.
  if (!in.good()) {
    std::cerr << "The file : " << filename << " do not exist. The program will now terminate \n";
    throw "The persistence landscape file do not exist. The program will now terminate \n";
  }

  double number;
  while (in >> number) {
    this->sorted_vector_of_distances.push_back(number);
  }
  in.close();
}